

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_shape_blow(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  undefined8 *puVar3;
  char *pcVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar3 = (undefined8 *)mem_zalloc(0x10);
    pcVar4 = parser_getstr(p,"blow");
    pcVar4 = string_make(pcVar4);
    puVar3[1] = pcVar4;
    *puVar3 = *(undefined8 *)((long)pvVar2 + 0x100);
    *(undefined8 **)((long)pvVar2 + 0x100) = puVar3;
    *(int *)((long)pvVar2 + 0x108) = *(int *)((long)pvVar2 + 0x108) + 1;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_shape_blow(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct player_blow *blow;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	blow = mem_zalloc(sizeof(*blow));
	blow->name = string_make(parser_getstr(p, "blow"));
	blow->next = shape->blows;
	shape->blows = blow;
	shape->num_blows++;
	return PARSE_ERROR_NONE;
}